

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O3

size_t __thiscall
pbrt::
HashMap<pbrt::LightHandle,_unsigned_int,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
::FindOffset(HashMap<pbrt::LightHandle,_unsigned_int,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
             *this,LightHandle *key)

{
  anon_struct_8_0_00000001_for___align aVar1;
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  aVar1 = (anon_struct_8_0_00000001_for___align)
          (key->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar3 = ((ulong)aVar1 & 0xffffffffffff) * -0x395b586ca42e166b;
  uVar3 = ((uVar3 >> 0x2f ^ uVar3) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8) * -0x395b586ca42e166b
  ;
  uVar3 = (uVar3 >> 0x2f ^ uVar3) * -0x395b586ca42e166b;
  poVar2 = (this->table).ptr;
  uVar5 = (this->table).nStored - 1;
  uVar3 = (uVar3 >> 0x2f ^ uVar3) & uVar5;
  if ((poVar2[uVar3].set == true) && (aVar1 != poVar2[uVar3].optionalValue.__align)) {
    uVar6 = 1;
    do {
      uVar4 = (ulong)(uVar6 * uVar6 >> 1) + (uVar6 >> 1) + uVar3 & uVar5;
      if (poVar2[uVar4].set != true) {
        return uVar4;
      }
      uVar6 = uVar6 + 1;
    } while (aVar1 != poVar2[uVar4].optionalValue.__align);
    return uVar4;
  }
  return uVar3;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }